

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_multisample_target.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *ctx;
  ALLEGRO_EVENT event;
  _Bool need_redraw;
  _Bool done;
  int h;
  int w;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  int local_80 [8];
  int local_60;
  byte local_32;
  byte local_31;
  undefined4 local_30;
  uint local_2c;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_4;
  
  local_4 = 0;
  local_2c = 0x294;
  local_30 = 0x1cc;
  local_31 = 0;
  local_32 = 1;
  uVar1 = al_install_system(0x85020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Failed to init Allegro.\n");
  }
  uVar1 = al_init_image_addon();
  if ((uVar1 & 1) == 0) {
    abort_example("Failed to init IIO addon.\n");
  }
  al_init_font_addon();
  example.font = (ALLEGRO_FONT *)al_create_builtin_font();
  al_init_primitives_addon();
  init_platform_specific();
  ctx = (char *)(ulong)local_2c;
  local_28 = al_create_display(ctx,local_30);
  if (local_28 == 0) {
    ctx = "Error creating display.\n";
    abort_example();
  }
  uVar1 = al_install_keyboard();
  if ((uVar1 & 1) == 0) {
    ctx = "Error installing keyboard.\n";
    abort_example();
  }
  init((EVP_PKEY_CTX *)ctx);
  local_18 = al_create_timer(0x3f91111111111111);
  uVar2 = al_create_event_queue();
  local_20 = uVar2;
  uVar3 = al_get_keyboard_event_source();
  al_register_event_source(uVar2,uVar3);
  uVar2 = local_20;
  uVar3 = al_get_timer_event_source(local_18);
  al_register_event_source(uVar2,uVar3);
  uVar2 = local_20;
  uVar3 = al_get_display_event_source(local_28);
  al_register_event_source(uVar2,uVar3);
  al_start_timer(local_18);
  while (((local_31 ^ 0xff) & 1) != 0) {
    if ((local_32 & 1) != 0) {
      redraw();
      al_flip_display();
      local_32 = 0;
    }
    do {
      al_wait_for_event(local_20,local_80);
      if (local_80[0] == 0xb) {
        if (local_60 == 0x3b) {
          local_31 = 1;
        }
      }
      else if (local_80[0] == 0x1e) {
        update();
        local_32 = 1;
      }
      else if (local_80[0] == 0x2a) {
        local_31 = 1;
      }
      uVar1 = al_is_event_queue_empty(local_20);
    } while ((uVar1 & 1) == 0);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_DISPLAY *display;
   int w = 20 + 300 + 20 + 300 + 20, h = 20 + 200 + 20 + 200 + 20;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   example.font = al_create_builtin_font();

   al_init_primitives_addon();

   init_platform_specific();

   display = al_create_display(w, h);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;

      if (need_redraw) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      while (true) {
         al_wait_for_event(queue, &event);
         switch (event.type) {
            case ALLEGRO_EVENT_KEY_CHAR:
               if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
                  done = true;
               break;

            case ALLEGRO_EVENT_DISPLAY_CLOSE:
               done = true;
               break;

            case ALLEGRO_EVENT_TIMER:
               update();
               need_redraw = true;
               break;
         }
         if (al_is_event_queue_empty(queue))
            break;
      }
   }

   return 0;
}